

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  long *plVar1;
  undefined *puVar2;
  undefined8 *puVar3;
  xml_parse_status xVar4;
  xml_memory_page *result;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  void *pvVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  void *pvVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  size_t local_58;
  
  _destroy(this);
  this->_memory[0x10] = '\0';
  this->_memory[0x11] = '\0';
  this->_memory[0x12] = '\0';
  this->_memory[0x13] = '\0';
  this->_memory[0x14] = '\0';
  this->_memory[0x15] = '\0';
  this->_memory[0x16] = '\0';
  this->_memory[0x17] = '\0';
  this->_memory[0x18] = '\0';
  this->_memory[0x19] = '\0';
  this->_memory[0x1a] = '\0';
  this->_memory[0x1b] = '\0';
  this->_memory[0x1c] = '\0';
  this->_memory[0x1d] = '\0';
  this->_memory[0x1e] = '\0';
  this->_memory[0x1f] = '\0';
  this->_memory[0] = '\0';
  this->_memory[1] = '\0';
  this->_memory[2] = '\0';
  this->_memory[3] = '\0';
  this->_memory[4] = '\0';
  this->_memory[5] = '\0';
  this->_memory[6] = '\0';
  this->_memory[7] = '\0';
  this->_memory[8] = '\0';
  this->_memory[9] = '\0';
  this->_memory[10] = '\0';
  this->_memory[0xb] = '\0';
  this->_memory[0xc] = '\0';
  this->_memory[0xd] = '\0';
  this->_memory[0xe] = '\0';
  this->_memory[0xf] = '\0';
  this->_memory[0x20] = '\0';
  this->_memory[0x21] = '\0';
  this->_memory[0x22] = '\0';
  this->_memory[0x23] = '\0';
  this->_memory[0x24] = '\0';
  this->_memory[0x25] = '\0';
  this->_memory[0x26] = '\0';
  this->_memory[0x27] = '\0';
  this->_memory[0x18] = -0x28;
  this->_memory[0x19] = '\x7f';
  this->_memory[0x1a] = '\0';
  this->_memory[0x1b] = '\0';
  this->_memory[0x1c] = '\0';
  this->_memory[0x1d] = '\0';
  this->_memory[0x1e] = '\0';
  this->_memory[0x1f] = '\0';
  doc = (xml_document_struct *)(this->_memory + 0x28);
  this->_memory[0x50] = '\0';
  this->_memory[0x51] = '\0';
  this->_memory[0x52] = '\0';
  this->_memory[0x53] = '\0';
  this->_memory[0x54] = '\0';
  this->_memory[0x55] = '\0';
  this->_memory[0x56] = '\0';
  this->_memory[0x57] = '\0';
  this->_memory[0x58] = '\0';
  this->_memory[0x59] = '\0';
  this->_memory[0x5a] = '\0';
  this->_memory[0x5b] = '\0';
  this->_memory[0x5c] = '\0';
  this->_memory[0x5d] = '\0';
  this->_memory[0x5e] = '\0';
  this->_memory[0x5f] = '\0';
  this->_memory[0x30] = '\0';
  this->_memory[0x31] = '\0';
  this->_memory[0x32] = '\0';
  this->_memory[0x33] = '\0';
  this->_memory[0x34] = '\0';
  this->_memory[0x35] = '\0';
  this->_memory[0x36] = '\0';
  this->_memory[0x37] = '\0';
  this->_memory[0x38] = '\0';
  this->_memory[0x39] = '\0';
  this->_memory[0x3a] = '\0';
  this->_memory[0x3b] = '\0';
  this->_memory[0x3c] = '\0';
  this->_memory[0x3d] = '\0';
  this->_memory[0x3e] = '\0';
  this->_memory[0x3f] = '\0';
  this->_memory[0x40] = '\0';
  this->_memory[0x41] = '\0';
  this->_memory[0x42] = '\0';
  this->_memory[0x43] = '\0';
  this->_memory[0x44] = '\0';
  this->_memory[0x45] = '\0';
  this->_memory[0x46] = '\0';
  this->_memory[0x47] = '\0';
  this->_memory[0x48] = '\0';
  this->_memory[0x49] = '\0';
  this->_memory[0x4a] = '\0';
  this->_memory[0x4b] = '\0';
  this->_memory[0x4c] = '\0';
  this->_memory[0x4d] = '\0';
  this->_memory[0x4e] = '\0';
  this->_memory[0x4f] = '\0';
  this->_memory[0x60] = '\0';
  this->_memory[0x61] = '\0';
  this->_memory[0x62] = '\0';
  this->_memory[99] = '\0';
  this->_memory[100] = '\0';
  this->_memory[0x65] = '\0';
  this->_memory[0x66] = '\0';
  this->_memory[0x67] = '\0';
  this->_memory[0x28] = '\x01';
  this->_memory[0x29] = '(';
  this->_memory[0x2a] = '\0';
  this->_memory[0x2b] = '\0';
  this->_memory[0x2c] = '\0';
  this->_memory[0x2d] = '\0';
  this->_memory[0x2e] = '\0';
  this->_memory[0x2f] = '\0';
  *(char **)(this->_memory + 0x68) = this->_memory;
  this->_memory[0x70] = -0x28;
  this->_memory[0x71] = '\x7f';
  this->_memory[0x72] = '\0';
  this->_memory[0x73] = '\0';
  this->_memory[0x74] = '\0';
  this->_memory[0x75] = '\0';
  this->_memory[0x76] = '\0';
  this->_memory[0x77] = '\0';
  this->_memory[0x78] = '\0';
  this->_memory[0x79] = '\0';
  this->_memory[0x7a] = '\0';
  this->_memory[0x7b] = '\0';
  this->_memory[0x7c] = '\0';
  this->_memory[0x7d] = '\0';
  this->_memory[0x7e] = '\0';
  this->_memory[0x7f] = '\0';
  this->_memory[0x80] = '\0';
  this->_memory[0x81] = '\0';
  this->_memory[0x82] = '\0';
  this->_memory[0x83] = '\0';
  this->_memory[0x84] = '\0';
  this->_memory[0x85] = '\0';
  this->_memory[0x86] = '\0';
  this->_memory[0x87] = '\0';
  (this->super_xml_node)._root = (xml_node_struct *)doc;
  *(xml_document_struct **)(this->_memory + 0x50) = doc;
  *(char **)this->_memory = this->_memory + 0x68;
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    lVar5 = std::wistream::tellg();
    if (lVar5 < 0) {
      xVar4 = std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
      puVar10 = (undefined8 *)0x0;
      local_58 = 0;
      puVar11 = (undefined8 *)0x0;
      do {
        if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) {
          pvVar12 = (void *)(*(code *)impl::(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)
                                      (local_58 + 1);
          xVar4 = status_ok;
          if (pvVar12 == (void *)0x0) {
            xVar4 = status_out_of_memory;
            local_58 = 0;
            pvVar12 = (void *)0x0;
          }
          else {
            puVar11 = puVar10;
            pvVar8 = pvVar12;
            if (puVar10 != (undefined8 *)0x0) {
              do {
                memcpy(pvVar8,puVar11 + 2,puVar11[1]);
                plVar1 = puVar11 + 1;
                puVar11 = (undefined8 *)*puVar11;
                pvVar8 = (void *)((long)pvVar8 + *plVar1);
              } while (puVar11 != (undefined8 *)0x0);
              xVar4 = status_ok;
            }
          }
          goto LAB_00126670;
        }
        puVar7 = (undefined8 *)
                 (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>
                           ::allocate)(0x7fe8);
        if (puVar7 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)0x0;
        }
        else {
          *puVar7 = 0;
          puVar7[1] = 0;
        }
        if (puVar7 == (undefined8 *)0x0) {
          xVar4 = status_out_of_memory;
          bVar13 = false;
          puVar7 = puVar11;
        }
        else {
          puVar3 = puVar7;
          if (puVar11 != (undefined8 *)0x0) {
            *puVar11 = puVar7;
            puVar3 = puVar10;
          }
          puVar10 = puVar3;
          std::wistream::read((wchar_t *)stream,(long)(puVar7 + 2));
          lVar5 = *(long *)(stream + 8);
          puVar7[1] = lVar5 * 4;
          if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
              (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
            xVar4 = status_io_error;
            bVar13 = false;
          }
          else {
            uVar9 = lVar5 * 4 + local_58;
            bVar13 = local_58 <= uVar9;
            if (local_58 < uVar9) {
              local_58 = uVar9;
            }
            if (!bVar13) {
              xVar4 = status_out_of_memory;
            }
          }
        }
        puVar11 = puVar7;
      } while (bVar13);
      local_58 = 0;
      pvVar12 = (void *)0x0;
LAB_00126670:
      while (puVar10 != (undefined8 *)0x0) {
        puVar11 = (undefined8 *)*puVar10;
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)(puVar10);
        puVar10 = puVar11;
      }
    }
    else {
      auVar14 = std::wistream::tellg();
      lVar5 = auVar14._0_8_;
      local_58 = 0;
      xVar4 = status_io_error;
      std::wistream::seekg((long)stream,_S_beg);
      lVar6 = std::wistream::tellg();
      std::wistream::seekg(stream,lVar5,auVar14._8_8_);
      pvVar12 = (void *)0x0;
      if (-1 < lVar5 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
        if (lVar6 - lVar5 < 0) {
          xVar4 = status_out_of_memory;
          local_58 = 0;
          pvVar12 = (void *)0x0;
        }
        else {
          pvVar12 = (void *)(*(code *)impl::(anonymous_namespace)::
                                      xml_memory_management_function_storage<int>::allocate)
                                      ((lVar6 - lVar5) * 4 + 1);
          puVar2 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                   deallocate;
          pvVar8 = pvVar12;
          if (pvVar12 == (void *)0x0) {
            xVar4 = status_out_of_memory;
            local_58 = 0;
            pvVar12 = (void *)0x0;
          }
          else {
            std::wistream::read((wchar_t *)stream,(long)pvVar12);
            if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
                (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
              xVar4 = status_io_error;
              local_58 = 0;
              pvVar12 = (void *)0x0;
            }
            else {
              local_58 = *(long *)(stream + 8) << 2;
              xVar4 = status_ok;
              pvVar8 = (void *)0x0;
            }
          }
          if (pvVar8 != (void *)0x0) {
            (*(code *)puVar2)(pvVar8);
          }
        }
      }
    }
    if (xVar4 == status_ok) {
      impl::anon_unknown_0::load_buffer_impl
                (__return_storage_ptr__,doc,(xml_node_struct *)doc,pvVar12,local_58,options,
                 encoding_utf32_le,true,true,&this->_buffer);
    }
    else {
      __return_storage_ptr__->offset = 0;
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = xVar4;
    }
  }
  else {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t>& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}